

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O2

IssuePtr __thiscall
libcellml::Validator::ValidatorImpl::makeIssueIllegalIdentifier(ValidatorImpl *this,string *name)

{
  IssueImpl *this_00;
  ReferenceRule RVar1;
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  IssuePtr IVar2;
  allocator<char> local_39;
  string local_38;
  
  Issue::IssueImpl::create();
  RVar1 = validateCellmlIdentifier(in_RDX);
  Issue::IssueImpl::setReferenceRule
            ((IssueImpl *)
             (this->super_LoggerImpl).mErrors.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[1],XML_ID_ATTRIBUTE);
  this_00 = (IssueImpl *)
            (this->super_LoggerImpl).mErrors.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[1];
  if (RVar1 == DATA_REPR_IDENTIFIER_BEGIN_EURO_NUM) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,
               "CellML identifiers must not begin with a European numeric character [0-9].",
               &local_39);
    Issue::IssueImpl::setDescription(this_00,&local_38);
  }
  else if (RVar1 == DATA_REPR_IDENTIFIER_AT_LEAST_ONE_ALPHANUM) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,
               "CellML identifiers must contain one or more basic Latin alphabetic characters.",
               &local_39);
    Issue::IssueImpl::setDescription(this_00,&local_38);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,
               "CellML identifiers must not contain any characters other than [a-zA-Z0-9_].",
               &local_39);
    Issue::IssueImpl::setDescription(this_00,&local_38);
  }
  std::__cxx11::string::~string((string *)&local_38);
  IVar2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  IVar2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (IssuePtr)IVar2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

IssuePtr Validator::ValidatorImpl::makeIssueIllegalIdentifier(const std::string &name) const
{
    auto issue = Issue::IssueImpl::create();
    auto referenceRule = validateCellmlIdentifier(name);
    issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_ID_ATTRIBUTE);

    if (referenceRule == Issue::ReferenceRule::DATA_REPR_IDENTIFIER_AT_LEAST_ONE_ALPHANUM) {
        // One or more alphabetic characters.
        issue->mPimpl->setDescription("CellML identifiers must contain one or more basic Latin alphabetic characters.");
    } else if (referenceRule == Issue::ReferenceRule::DATA_REPR_IDENTIFIER_BEGIN_EURO_NUM) {
        // Does not start with numeric character.
        issue->mPimpl->setDescription("CellML identifiers must not begin with a European numeric character [0-9].");
    } else { /* referenceRule == Issue::ReferenceRule::DATA_REPR_IDENTIFIER_LATIN_ALPHANUM */
        // Basic Latin alphanumeric characters and underscores.
        issue->mPimpl->setDescription("CellML identifiers must not contain any characters other than [a-zA-Z0-9_].");
    }

    return issue;
}